

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression.c
# Opt level: O1

void cftfsub(size_t n,float *a,float *w)

{
  undefined8 uVar1;
  size_t l;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar3 = 2;
  if (8 < n) {
    cft1st(n,a,w);
    uVar3 = 8;
    if (0x20 < n) {
      uVar2 = 0x20;
      l = 8;
      do {
        uVar3 = uVar2;
        cftmdl(n,l,a,w);
        uVar2 = uVar3 * 4;
        l = uVar3;
      } while (uVar3 * 4 < n);
    }
  }
  if (uVar3 * 4 - n == 0) {
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        fVar8 = (float)*(undefined8 *)(a + uVar2);
        fVar9 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
        fVar12 = (float)*(undefined8 *)(a + uVar3 + uVar2);
        fVar6 = fVar8 + fVar12;
        fVar4 = (float)((ulong)*(undefined8 *)(a + uVar3 + uVar2) >> 0x20);
        fVar7 = fVar9 + fVar4;
        fVar8 = fVar8 - fVar12;
        fVar9 = fVar9 - fVar4;
        fVar12 = (float)*(undefined8 *)(a + uVar3 * 2 + uVar2);
        fVar13 = (float)((ulong)*(undefined8 *)(a + uVar3 * 2 + uVar2) >> 0x20);
        fVar10 = (float)*(undefined8 *)(a + uVar3 * 3 + uVar2);
        fVar4 = fVar12 - fVar10;
        fVar11 = (float)((ulong)*(undefined8 *)(a + uVar3 * 3 + uVar2) >> 0x20);
        fVar5 = fVar13 - fVar11;
        fVar12 = fVar12 + fVar10;
        fVar13 = fVar13 + fVar11;
        *(ulong *)(a + uVar2) = CONCAT44(fVar7 + fVar13,fVar6 + fVar12);
        *(ulong *)(a + uVar3 * 2 + uVar2) = CONCAT44(fVar7 - fVar13,fVar6 - fVar12);
        a[uVar3 + uVar2] = fVar8 - fVar5;
        a[uVar3 + uVar2 + 1] = fVar9 + fVar4;
        a[uVar3 * 3 + uVar2] = fVar5 + fVar8;
        a[uVar3 * 3 + uVar2 + 1] = fVar9 - fVar4;
        uVar2 = uVar2 + 2;
      } while (uVar2 < uVar3);
    }
  }
  else if (uVar3 != 0) {
    uVar2 = 0;
    do {
      uVar1 = *(undefined8 *)(a + uVar3 + uVar2);
      fVar12 = (float)*(undefined8 *)(a + uVar2);
      fVar4 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
      fVar13 = (float)uVar1;
      a[uVar2] = fVar13 + fVar12;
      a[uVar2 + 1] = fVar4 + a[uVar3 + uVar2 + 1];
      *(ulong *)(a + uVar3 + uVar2) =
           CONCAT44(fVar4 - (float)((ulong)uVar1 >> 0x20),fVar12 - fVar13);
      uVar2 = uVar2 + 2;
    } while (uVar2 < uVar3);
  }
  return;
}

Assistant:

static void cftfsub(size_t n, float *a, float *w) {
    size_t j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}